

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O0

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  GLFWwindow *window;
  
  memset(joysticks,0,0x40);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  find_joysticks();
  glfwSetJoystickCallback(joystick_callback);
  handle = glfwCreateWindow(0x280,0x1e0,"Joystick Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
  glfwMakeContextCurrent(handle);
  gladLoadGLLoader(glfwGetProcAddress);
  glfwSwapInterval(1);
  while( true ) {
    iVar1 = glfwWindowShouldClose(handle);
    if (iVar1 != 0) break;
    (*glad_glClear)(0x4000);
    draw_joysticks(handle);
    glfwSwapBuffers(handle);
    glfwPollEvents();
    fflush(_stdout);
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    memset(joysticks, 0, sizeof(joysticks));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    find_joysticks();
    glfwSetJoystickCallback(joystick_callback);

    window = glfwCreateWindow(640, 480, "Joystick Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        draw_joysticks(window);

        glfwSwapBuffers(window);
        glfwPollEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}